

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

void __thiscall cmListFileBacktrace::PrintCallStack(cmListFileBacktrace *this,ostream *out)

{
  string *remote_path;
  pointer pcVar1;
  bool bVar2;
  cmState *pcVar3;
  char *pcVar4;
  size_type sVar5;
  Entry *pEVar6;
  cmListFileContext lfc;
  cmOutputConverter converter;
  allocator local_d9;
  cmListFileContext local_d8;
  string local_90;
  string local_70;
  cmOutputConverter local_50;
  
  if ((this->Cur != (Entry *)0x0) && (this->Cur->Up != (Entry *)0x0)) {
    cmOutputConverter::cmOutputConverter(&local_50,&this->Bottom);
    pEVar6 = this->Cur->Up;
    if (pEVar6 != (Entry *)0x0) {
      remote_path = &local_d8.FilePath;
      bVar2 = true;
      do {
        sVar5 = (pEVar6->super_cmListFileContext).Name._M_string_length;
        if (sVar5 != 0) {
          if (bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,"Call Stack (most recent call first):\n",0x25);
            sVar5 = (pEVar6->super_cmListFileContext).Name._M_string_length;
          }
          local_d8.Name._M_dataplus._M_p = (pointer)&local_d8.Name.field_2;
          pcVar1 = (pEVar6->super_cmListFileContext).Name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar1,pcVar1 + sVar5);
          local_d8.FilePath._M_dataplus._M_p = (pointer)&local_d8.FilePath.field_2;
          pcVar1 = (pEVar6->super_cmListFileContext).FilePath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)remote_path,pcVar1,
                     pcVar1 + (pEVar6->super_cmListFileContext).FilePath._M_string_length);
          local_d8.Line = (pEVar6->super_cmListFileContext).Line;
          pcVar3 = cmStateSnapshot::GetState(&this->Bottom);
          bVar2 = cmState::GetIsInTryCompile(pcVar3);
          if (!bVar2) {
            pcVar3 = cmStateSnapshot::GetState(&this->Bottom);
            pcVar4 = cmState::GetSourceDirectory(pcVar3);
            std::__cxx11::string::string((string *)&local_90,pcVar4,&local_d9);
            cmOutputConverter::ConvertToRelativePath(&local_70,&local_50,&local_90,remote_path);
            std::__cxx11::string::operator=((string *)remote_path,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
          operator<<(out,&local_d8);
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.FilePath._M_dataplus._M_p != &local_d8.FilePath.field_2) {
            operator_delete(local_d8.FilePath._M_dataplus._M_p,
                            local_d8.FilePath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.Name._M_dataplus._M_p != &local_d8.Name.field_2) {
            operator_delete(local_d8.Name._M_dataplus._M_p,
                            local_d8.Name.field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
        pEVar6 = pEVar6->Up;
      } while (pEVar6 != (Entry *)0x0);
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintCallStack(std::ostream& out) const
{
  if (!this->Cur || !this->Cur->Up) {
    return;
  }

  bool first = true;
  cmOutputConverter converter(this->Bottom);
  for (Entry* i = this->Cur->Up; i; i = i->Up) {
    if (i->Name.empty()) {
      // Skip this whole-file scope.  When we get here we already will
      // have printed a more-specific context within the file.
      continue;
    }
    if (first) {
      first = false;
      out << "Call Stack (most recent call first):\n";
    }
    cmListFileContext lfc = *i;
    if (!this->Bottom.GetState()->GetIsInTryCompile()) {
      lfc.FilePath = converter.ConvertToRelativePath(
        this->Bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
    }
    out << "  " << lfc << "\n";
  }
}